

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O1

void __thiscall Command_Bad_Test::TestBody(Command_Bad_Test *this)

{
  mock_cp *this_00;
  FunctionMocker<void_(const_pstore::broker::broker_command_&)> *this_01;
  TypedExpectation<void_(const_pstore::broker::broker_command_&)> *this_02;
  message_type msg;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  char *local_1b0;
  size_type local_1a8;
  char local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  shared_ptr<testing::internal::ExpectationBase> *local_190;
  size_type local_188;
  shared_ptr<testing::internal::ExpectationBase> local_180;
  MatcherBase<const_pstore::broker::broker_command_&> local_170;
  MatcherBase<const_pstore::broker::broker_command_&> local_158;
  MatcherBase<const_pstore::broker::broker_command_&> local_140;
  undefined1 local_128 [32];
  _Alloc_hider local_108;
  size_type local_100;
  char local_f8 [208];
  
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"bad","");
  local_1b0 = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"command","");
  local_128._0_8_ = local_128 + 0x10;
  if (local_190 == &local_180) {
    local_128._24_8_ =
         local_180.
         super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    local_128._0_8_ = local_190;
  }
  local_108._M_p = local_f8;
  local_128._8_8_ = local_188;
  local_188 = 0;
  local_180.super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_1_ = 0;
  if (local_1b0 == &local_1a0) {
    local_f8[8] = (undefined1)uStack_198;
    local_f8[9] = uStack_198._1_1_;
    local_f8[10] = uStack_198._2_1_;
    local_f8[0xb] = uStack_198._3_1_;
    local_f8[0xc] = uStack_198._4_1_;
    local_f8[0xd] = uStack_198._5_1_;
    local_f8[0xe] = uStack_198._6_1_;
    local_f8[0xf] = uStack_198._7_1_;
  }
  else {
    local_108._M_p = local_1b0;
  }
  local_100 = local_1a8;
  local_1a8 = 0;
  local_1a0 = '\0';
  local_1b0 = &local_1a0;
  local_190 = &local_180;
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher
            ((Matcher<const_pstore::broker::broker_command_&> *)&local_158,
             (broker_command *)local_128);
  this_00 = &(this->super_Command).cp_;
  this_01 = &(this->super_Command).cp_.gmock11_unknown_53;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_01->super_UntypedFunctionMockerBase,this_00);
  local_170.buffer_.ptr = local_158.buffer_.ptr;
  if ((local_158.vtable_ != (VTable *)0x0) &&
     ((local_158.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_158.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_158.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_170.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00197890;
  local_140.vtable_ = local_158.vtable_;
  local_140.buffer_.ptr = local_158.buffer_.ptr;
  local_170.vtable_ = (VTable *)0x0;
  local_140.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00197890;
  local_1c0._M_allocated_capacity = (size_type)local_158.vtable_;
  local_1c0._8_8_ = local_158.buffer_;
  if ((local_158.vtable_ != (VTable *)0x0) &&
     ((local_158.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_158.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_158.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1d0._8_8_ = &PTR__MatcherBase_00197890;
  local_1d0._0_8_ = this_01;
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_140);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_170);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(const_pstore::broker::broker_command_&)>::
            InternalExpectedAt((MockSpec<void_(const_pstore::broker::broker_command_&)> *)local_1d0,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                               ,0x6a,"cp ()",
                               "unknown (pstore::broker::broker_command{\"bad\", \"command\"})");
  testing::internal::TypedExpectation<void_(const_pstore::broker::broker_command_&)>::Times
            (this_02,1);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)(local_1d0 + 8));
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_158);
  pstore::broker::broker_command::~broker_command((broker_command *)local_128);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,
                    CONCAT71(local_180.
                             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._1_7_,
                             local_180.
                             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._0_1_) + 1);
  }
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bad command","");
  pstore::brokerface::message_type::message_type
            ((message_type *)local_128,0,0,1,(string *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
  }
  pstore::broker::command_processor::process_command
            (&this_00->super_command_processor,&(this->super_Command).fifo_,
             (message_type *)local_128);
  return;
}

Assistant:

TEST_F (Command, Bad) {
    EXPECT_CALL (cp (), unknown (pstore::broker::broker_command{"bad", "command"})).Times (1);

    pstore::brokerface::message_type msg{message_id, part_no, num_parts, "bad command"};
    cp ().process_command (fifo (), msg);
}